

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.h
# Opt level: O2

void __thiscall CompilationContext::Poolable::Poolable(Poolable *this,CompilationContext *ctx_)

{
  Poolable *local_8;
  
  this->ctx = ctx_;
  local_8 = this;
  std::vector<CompilationContext::Poolable*,std::allocator<CompilationContext::Poolable*>>::
  emplace_back<CompilationContext::Poolable*>
            ((vector<CompilationContext::Poolable*,std::allocator<CompilationContext::Poolable*>> *)
             &ctx_->poolableObjects,&local_8);
  return;
}

Assistant:

Poolable(CompilationContext & ctx_) : ctx(ctx_)
    {
      ctx.poolableObjects.push_back(this);
    }